

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParsePEReference(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *str1;
  xmlParserInputPtr value;
  xmlParserInputPtr input;
  xmlEntityPtr entity;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  input = (xmlParserInputPtr)0x0;
  if (*ctxt->input->cur == '%') {
    xmlNextChar(ctxt);
    str1 = xmlParseName(ctxt);
    if (str1 == (xmlChar *)0x0) {
      xmlFatalErrMsg(ctxt,XML_ERR_PEREF_NO_NAME,"PEReference: no name\n");
    }
    else if (*ctxt->input->cur == ';') {
      xmlNextChar(ctxt);
      ctxt->hasPErefs = 1;
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (ctxt->sax->getParameterEntity != (getParameterEntitySAXFunc)0x0)) {
        input = (xmlParserInputPtr)(*ctxt->sax->getParameterEntity)(ctxt->userData,str1);
      }
      if (input == (xmlParserInputPtr)0x0) {
        xmlHandleUndeclaredEntity(ctxt,str1);
      }
      else if ((*(int *)((long)&input->version + 4) == 4) ||
              (*(int *)((long)&input->version + 4) == 5)) {
        if ((*(int *)((long)&input->version + 4) != 5) ||
           (((ctxt->options & 0x800000U) == 0 &&
            (((ctxt->loadsubset != 0 || (ctxt->replaceEntities != 0)) || (ctxt->validate != 0))))))
        {
          if (((ulong)input[1].filename & 0x800000000) == 0) {
            value = xmlNewEntityInputStream(ctxt,(xmlEntityPtr)input);
            iVar1 = xmlCtxtPushInput(ctxt,value);
            if (iVar1 < 0) {
              xmlFreeInputStream(value);
            }
            else {
              *(uint *)((long)&input[1].filename + 4) = *(uint *)((long)&input[1].filename + 4) | 8;
              if (((ctxt->input->flags & 0x40U) == 0) &&
                 ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                xmlParserGrow(ctxt);
              }
              if ((((*(int *)((long)&input->version + 4) == 5) &&
                   (xmlDetectEncoding(ctxt), *ctxt->input->cur == '<')) &&
                  ((ctxt->input->cur[1] == '?' &&
                   (((ctxt->input->cur[2] == 'x' && (ctxt->input->cur[3] == 'm')) &&
                    (ctxt->input->cur[4] == 'l')))))) &&
                 (((ctxt->input->cur[5] == ' ' ||
                   ((8 < ctxt->input->cur[5] && (ctxt->input->cur[5] < 0xb)))) ||
                  (ctxt->input->cur[5] == '\r')))) {
                xmlParseTextDecl(ctxt);
              }
            }
          }
          else {
            xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
            xmlHaltParser(ctxt);
          }
        }
      }
      else {
        xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"Internal: %%%s; is not a parameter entity\n",
                      str1,(xmlChar *)0x0);
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_PEREF_SEMICOL_MISSING,(char *)0x0);
    }
  }
  return;
}

Assistant:

void
xmlParsePEReference(xmlParserCtxtPtr ctxt)
{
    const xmlChar *name;
    xmlEntityPtr entity = NULL;
    xmlParserInputPtr input;

    if (RAW != '%')
        return;
    NEXT;
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_PEREF_NO_NAME, "PEReference: no name\n");
	return;
    }
    if (RAW != ';') {
	xmlFatalErr(ctxt, XML_ERR_PEREF_SEMICOL_MISSING, NULL);
        return;
    }

    NEXT;

    /* Must be set before xmlHandleUndeclaredEntity */
    ctxt->hasPErefs = 1;

    /*
     * Request the entity from SAX
     */
    if ((ctxt->sax != NULL) &&
	(ctxt->sax->getParameterEntity != NULL))
	entity = ctxt->sax->getParameterEntity(ctxt->userData, name);

    if (entity == NULL) {
        xmlHandleUndeclaredEntity(ctxt, name);
    } else {
	/*
	 * Internal checking in case the entity quest barfed
	 */
	if ((entity->etype != XML_INTERNAL_PARAMETER_ENTITY) &&
	    (entity->etype != XML_EXTERNAL_PARAMETER_ENTITY)) {
	    xmlWarningMsg(ctxt, XML_WAR_UNDECLARED_ENTITY,
		  "Internal: %%%s; is not a parameter entity\n",
			  name, NULL);
	} else {
	    if ((entity->etype == XML_EXTERNAL_PARAMETER_ENTITY) &&
                ((ctxt->options & XML_PARSE_NO_XXE) ||
		 ((ctxt->loadsubset == 0) &&
		  (ctxt->replaceEntities == 0) &&
		  (ctxt->validate == 0))))
		return;

            if (entity->flags & XML_ENT_EXPANDING) {
                xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
                xmlHaltParser(ctxt);
                return;
            }

	    input = xmlNewEntityInputStream(ctxt, entity);
	    if (xmlCtxtPushInput(ctxt, input) < 0) {
                xmlFreeInputStream(input);
		return;
            }

            entity->flags |= XML_ENT_EXPANDING;

            GROW;

	    if (entity->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
                xmlDetectEncoding(ctxt);

                if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) &&
                    (IS_BLANK_CH(NXT(5)))) {
                    xmlParseTextDecl(ctxt);
                }
            }
	}
    }
}